

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_sbit_decoder_load_bitmap
                   (TT_SBitDecoder decoder,FT_UInt glyph_format,FT_ULong glyph_start,
                   FT_ULong glyph_size,FT_Int x_pos,FT_Int y_pos,FT_UInt recurse_count,
                   FT_Bool metrics_only)

{
  byte *limit;
  FT_Stream stream;
  TT_SBit_Metrics pTVar1;
  byte *pbVar2;
  FT_Error FVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  code *pcVar7;
  FT_Byte *p;
  byte *local_48;
  FT_Int local_3c;
  byte *local_38;
  
  if (glyph_size == 0) {
    return 6;
  }
  if (decoder->ebdt_size < glyph_size + glyph_start) {
    return 6;
  }
  stream = decoder->stream;
  local_3c = y_pos;
  FVar3 = FT_Stream_Seek(stream,glyph_start + decoder->ebdt_start);
  if (FVar3 != 0) {
    return FVar3;
  }
  FVar3 = FT_Stream_ExtractFrame(stream,glyph_size,&local_38);
  if (FVar3 != 0) {
    return FVar3;
  }
  local_48 = local_38;
  limit = local_38 + glyph_size;
  FVar3 = 0;
  if (glyph_format < 0x13) {
    if ((0x20106U >> (glyph_format & 0x1f) & 1) == 0) {
      FVar3 = 0;
      if ((0x402c0U >> (glyph_format & 0x1f) & 1) != 0) {
        FVar3 = tt_sbit_decoder_load_metrics(decoder,&local_48,limit,'\x01');
      }
    }
    else {
      FVar3 = 6;
      if (4 < (long)glyph_size) {
        local_48 = local_38 + 5;
        pTVar1 = decoder->metrics;
        pTVar1->height = (ushort)*local_38;
        pTVar1->width = (ushort)local_38[1];
        pTVar1->horiBearingX = (short)(char)local_38[2];
        pTVar1->horiBearingY = (short)(char)local_38[3];
        pTVar1->horiAdvance = (ushort)local_38[4];
        pTVar1->vertBearingX = 0;
        pTVar1->vertBearingY = 0;
        pTVar1->vertAdvance = 0;
        decoder->metrics_loaded = '\x01';
        FVar3 = 0;
      }
    }
  }
  if (FVar3 != 0) goto LAB_0024df94;
  pcVar7 = tt_sbit_decoder_load_byte_aligned;
  pbVar2 = local_48;
  switch(glyph_format) {
  case 1:
  case 6:
    break;
  case 2:
  case 7:
    uVar6 = (uint)decoder->metrics->height;
    uVar4 = (uint)decoder->metrics->width;
    uVar5 = (uVar4 + 7 >> 3) * uVar6;
    if ((uVar5 <= uVar6 * uVar4 + 7 >> 3) || (uVar5 != (int)limit - (int)local_48))
    goto switchD_0024dfc1_caseD_5;
    break;
  default:
    FVar3 = 8;
    goto LAB_0024df94;
  case 5:
switchD_0024dfc1_caseD_5:
    pcVar7 = tt_sbit_decoder_load_bit_aligned;
    break;
  case 8:
    pbVar2 = local_48 + 1;
    if (local_48 + 1 <= limit) goto switchD_0024dfc1_caseD_9;
    goto LAB_0024e038;
  case 9:
switchD_0024dfc1_caseD_9:
    local_48 = pbVar2;
    pcVar7 = tt_sbit_decoder_load_compound;
    break;
  case 0x11:
  case 0x12:
  case 0x13:
    FVar3 = 7;
    goto LAB_0024df94;
  }
  if ((decoder->bitmap_allocated != '\0') ||
     (FVar3 = tt_sbit_decoder_alloc_bitmap(decoder,metrics_only), FVar3 == 0)) {
    if (metrics_only == '\0') {
      FVar3 = (*pcVar7)(decoder,local_48,limit,x_pos,local_3c,recurse_count);
    }
    else {
LAB_0024e038:
      FVar3 = 0;
    }
  }
LAB_0024df94:
  FT_Stream_ReleaseFrame(stream,&local_38);
  return FVar3;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bitmap( TT_SBitDecoder  decoder,
                               FT_UInt         glyph_format,
                               FT_ULong        glyph_start,
                               FT_ULong        glyph_size,
                               FT_Int          x_pos,
                               FT_Int          y_pos,
                               FT_UInt         recurse_count,
                               FT_Bool         metrics_only )
  {
    FT_Error   error;
    FT_Stream  stream = decoder->stream;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_Byte*   data;


    /* seek into the EBDT table now */
    if ( !glyph_size                                   ||
         glyph_start + glyph_size > decoder->ebdt_size )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( FT_STREAM_SEEK( decoder->ebdt_start + glyph_start ) ||
         FT_FRAME_EXTRACT( glyph_size, data )                )
      goto Exit;

    p       = data;
    p_limit = p + glyph_size;

    /* read the data, depending on the glyph format */
    switch ( glyph_format )
    {
    case 1:
    case 2:
    case 8:
    case 17:
      error = tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 0 );
      break;

    case 6:
    case 7:
    case 9:
    case 18:
      error = tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 );
      break;

    default:
      error = FT_Err_Ok;
    }

    if ( error )
      goto Fail;

    {
      TT_SBitDecoder_LoadFunc  loader;


      switch ( glyph_format )
      {
      case 1:
      case 6:
        loader = tt_sbit_decoder_load_byte_aligned;
        break;

      case 2:
      case 7:
        {
          /* Don't trust `glyph_format'.  For example, Apple's main Korean */
          /* system font, `AppleMyungJo.ttf' (version 7.0d2e6), uses glyph */
          /* format 7, but the data is format 6.  We check whether we have */
          /* an excessive number of bytes in the image: If it is equal to  */
          /* the value for a byte-aligned glyph, use the other loading     */
          /* routine.                                                      */
          /*                                                               */
          /* Note that for some (width,height) combinations, where the     */
          /* width is not a multiple of 8, the sizes for bit- and          */
          /* byte-aligned data are equal, for example (7,7) or (15,6).  We */
          /* then prefer what `glyph_format' specifies.                    */

          FT_UInt  width  = decoder->metrics->width;
          FT_UInt  height = decoder->metrics->height;

          FT_UInt  bit_size  = ( width * height + 7 ) >> 3;
          FT_UInt  byte_size = height * ( ( width + 7 ) >> 3 );


          if ( bit_size < byte_size                  &&
               byte_size == (FT_UInt)( p_limit - p ) )
            loader = tt_sbit_decoder_load_byte_aligned;
          else
            loader = tt_sbit_decoder_load_bit_aligned;
        }
        break;

      case 5:
        loader = tt_sbit_decoder_load_bit_aligned;
        break;

      case 8:
        if ( p + 1 > p_limit )
          goto Fail;

        p += 1;  /* skip padding */
        FALL_THROUGH;

      case 9:
        loader = tt_sbit_decoder_load_compound;
        break;

      case 17: /* small metrics, PNG image data   */
      case 18: /* big metrics, PNG image data     */
      case 19: /* metrics in EBLC, PNG image data */
#ifdef FT_CONFIG_OPTION_USE_PNG
        loader = tt_sbit_decoder_load_png;
        break;
#else
        error = FT_THROW( Unimplemented_Feature );
        goto Fail;
#endif /* FT_CONFIG_OPTION_USE_PNG */

      default:
        error = FT_THROW( Invalid_Table );
        goto Fail;
      }

      if ( !decoder->bitmap_allocated )
      {
        error = tt_sbit_decoder_alloc_bitmap( decoder, metrics_only );

        if ( error )
          goto Fail;
      }

      if ( metrics_only )
        goto Fail; /* this is not an error */

      error = loader( decoder, p, p_limit, x_pos, y_pos, recurse_count );
    }

  Fail:
    FT_FRAME_RELEASE( data );

  Exit:
    return error;
  }